

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QList<QString>_>::reallocateAndGrow
          (QArrayDataPointer<QList<QString>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QList<QString>_> *old)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  QString *pQVar3;
  Data *pDVar4;
  QList<QString> *pQVar5;
  bool bVar6;
  QList<QString> *pQVar7;
  qsizetype qVar8;
  long lVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  QArrayDataPointer<QList<QString>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QList<QString>_> *)0x0 && where == GrowsAtEnd) {
    pQVar1 = &this->d->super_QArrayData;
    if (pQVar1 == (QArrayData *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = 1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar6)) {
      if (pQVar1 == (QArrayData *)0x0) {
        qVar8 = 0;
        lVar9 = 0;
      }
      else {
        qVar8 = pQVar1->alloc;
        lVar9 = (this->size - pQVar1->alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
                -0x5555555555555555;
      }
      auVar10 = QArrayData::reallocateUnaligned(pQVar1,this->ptr,0x18,qVar8 + n + lVar9,Grow);
      this->d = (Data *)auVar10._0_8_;
      this->ptr = (QList<QString> *)auVar10._8_8_;
      goto LAB_0061db86;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QList<QString> *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar9 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pQVar7 = this->ptr;
    pQVar5 = pQVar7 + lVar9;
    if ((old != (QArrayDataPointer<QList<QString>_> *)0x0) || (bVar6)) {
      if ((lVar9 != 0) && (0 < lVar9)) {
        do {
          pDVar2 = (pQVar7->d).d;
          local_38.ptr[local_38.size].d.d = pDVar2;
          local_38.ptr[local_38.size].d.ptr = (pQVar7->d).ptr;
          local_38.ptr[local_38.size].d.size = (pQVar7->d).size;
          if (pDVar2 != (Data *)0x0) {
            LOCK();
            (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pQVar7 = pQVar7 + 1;
          local_38.size = local_38.size + 1;
        } while (pQVar7 < pQVar5);
      }
    }
    else if ((lVar9 != 0) && (0 < lVar9)) {
      do {
        pDVar2 = (pQVar7->d).d;
        (pQVar7->d).d = (Data *)0x0;
        local_38.ptr[local_38.size].d.d = pDVar2;
        pQVar3 = (pQVar7->d).ptr;
        (pQVar7->d).ptr = (QString *)0x0;
        local_38.ptr[local_38.size].d.ptr = pQVar3;
        qVar8 = (pQVar7->d).size;
        (pQVar7->d).size = 0;
        local_38.ptr[local_38.size].d.size = qVar8;
        pQVar7 = pQVar7 + 1;
        local_38.size = local_38.size + 1;
      } while (pQVar7 < pQVar5);
    }
  }
  pDVar4 = this->d;
  pQVar5 = this->ptr;
  this->d = local_38.d;
  this->ptr = local_38.ptr;
  qVar8 = this->size;
  this->size = local_38.size;
  local_38.d = pDVar4;
  local_38.ptr = pQVar5;
  local_38.size = qVar8;
  if (old != (QArrayDataPointer<QList<QString>_> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = pDVar4;
    old->ptr = pQVar5;
    local_38.size = old->size;
    old->size = qVar8;
  }
  ~QArrayDataPointer(&local_38);
LAB_0061db86:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }